

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  Curl_easy *data;
  unsigned_long uVar1;
  Curl_easy *data_00;
  size_t sVar2;
  long lVar3;
  byte bVar4;
  CURLcode CVar5;
  size_t insize;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  size_t maxlength;
  char *pcVar9;
  char **ppcVar10;
  char *authorization;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  data = conn->data;
  uVar1 = authstatus->picked;
  if (uVar1 != 1) {
    if (uVar1 == 2) {
      CVar5 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      pcVar6 = "Digest";
    }
    else if (uVar1 == 8) {
      CVar5 = Curl_output_ntlm(conn,proxy);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      pcVar6 = "NTLM";
    }
    else {
      pcVar6 = (char *)0x0;
    }
    goto LAB_00110aac;
  }
  if (proxy) {
    if (((conn->bits).proxy_user_passwd != true) ||
       (pcVar6 = Curl_checkProxyheaders(conn,"Proxy-authorization:"), pcVar6 != (char *)0x0)) {
      if (!proxy) goto LAB_00110a77;
      goto LAB_00110a99;
    }
LAB_00110b1b:
    local_38 = 0;
    local_48 = (char *)0x0;
    data_00 = conn->data;
    ppcVar10 = &conn->user;
    ppcVar8 = &conn->passwd;
    local_40 = 0x418;
    if (proxy) {
      local_40 = 0x400;
      ppcVar8 = &(conn->http_proxy).passwd;
      ppcVar10 = &(conn->http_proxy).user;
    }
    sVar2 = (data_00->set).buffer_size;
    maxlength = 0x4000;
    if (sVar2 != 0) {
      maxlength = sVar2;
    }
    curl_msnprintf((data_00->state).buffer,maxlength,"%s:%s",*ppcVar10,*ppcVar8);
    pcVar6 = (data_00->state).buffer;
    insize = strlen(pcVar6);
    CVar5 = Curl_base64_encode(data_00,pcVar6,insize,&local_48,&local_38);
    lVar3 = local_40;
    if (CVar5 == CURLE_OK) {
      if (local_48 == (char *)0x0) {
        CVar5 = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + local_40 + -8));
        pcVar6 = "";
        if (proxy) {
          pcVar6 = "Proxy-";
        }
        pcVar6 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar6,local_48);
        *(char **)((conn->chunk).hexbuffer + lVar3 + -8) = pcVar6;
        (*Curl_cfree)(local_48);
        CVar5 = CURLE_OUT_OF_MEMORY;
        if (*(long *)((conn->chunk).hexbuffer + lVar3 + -8) != 0) {
          CVar5 = CURLE_OK;
        }
      }
    }
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    pcVar6 = "Basic";
  }
  else {
LAB_00110a77:
    if (((conn->bits).user_passwd == true) &&
       (pcVar6 = Curl_checkheaders(conn,"Authorization:"), pcVar6 == (char *)0x0))
    goto LAB_00110b1b;
LAB_00110a99:
    pcVar6 = (char *)0x0;
  }
  authstatus->done = true;
LAB_00110aac:
  if (pcVar6 == (char *)0x0) {
    bVar4 = false;
  }
  else {
    pcVar7 = "Server";
    ppcVar10 = &conn->user;
    if (proxy) {
      pcVar7 = "Proxy";
      ppcVar10 = &(conn->http_proxy).user;
    }
    pcVar9 = "";
    if (*ppcVar10 != (char *)0x0) {
      pcVar9 = *ppcVar10;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'\n",pcVar7,pcVar6,pcVar9);
    bVar4 = authstatus->done ^ 1;
  }
  authstatus->multi = (_Bool)bVar4;
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS) || defined(USE_SPNEGO)
  struct Curl_easy *data = conn->data;
#endif
#ifdef USE_SPNEGO
  struct negotiatedata *negdata = proxy ?
    &data->state.proxyneg : &data->state.negotiate;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  negdata->state = GSS_AUTHNONE;
  if((authstatus->picked == CURLAUTH_NEGOTIATE) &&
     negdata->context && !GSS_ERROR(negdata->status)) {
    auth = "Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
    authstatus->done = TRUE;
    negdata->state = GSS_AUTHSENT;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth="NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization:")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization:"))) {
      auth = "Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (conn->http_proxy.user ? conn->http_proxy.user : "") :
                  (conn->user ? conn->user : ""));
    authstatus->multi = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multi = FALSE;

  return CURLE_OK;
}